

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::GetTxDataFromBlock(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&)> local_58;
  function<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&)> local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::function<cfd::js::api::BlockTxDataStruct(cfd::js::api::BlockTxRequestStruct_const&)>::
  function<cfd::js::api::BlockTxDataStruct(&)(cfd::js::api::BlockTxRequestStruct_const&),void>
            ((function<cfd::js::api::BlockTxDataStruct(cfd::js::api::BlockTxRequestStruct_const&)> *
             )&local_38,BlockStructApi::GetTxDataFromBlock);
  std::function<cfd::js::api::BlockTxDataStruct(cfd::js::api::BlockTxRequestStruct_const&)>::
  function<cfd::js::api::BlockTxDataStruct(&)(cfd::js::api::BlockTxRequestStruct_const&),void>
            ((function<cfd::js::api::BlockTxDataStruct(cfd::js::api::BlockTxRequestStruct_const&)> *
             )&local_58,ElementsBlockStructApi::GetTxDataFromBlock);
  ExecuteElementsCheckApi<cfd::js::api::json::BlockTxRequest,cfd::js::api::json::BlockTxData,cfd::js::api::BlockTxRequestStruct,cfd::js::api::BlockTxDataStruct>
            ((json *)this,request_message,&local_38,&local_58);
  std::function<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&)>::
  ~function(&local_58);
  std::function<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&)>::
  ~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::GetTxDataFromBlock(
    const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::BlockTxRequest, api::json::BlockTxData,
      api::BlockTxRequestStruct, api::BlockTxDataStruct>(
      request_message, BlockStructApi::GetTxDataFromBlock,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsBlockStructApi::GetTxDataFromBlock);
#else
      BlockStructApi::GetTxDataFromBlock);
#endif
}